

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemsave.c
# Opt level: O3

LispPTR vmem_save(char *sysout_file_name)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  LispPTR *pLVar4;
  int iVar5;
  int *piVar6;
  IFPAGE *pIVar7;
  __off_t _Var8;
  ssize_t sVar9;
  DLword DVar10;
  int iVar11;
  LispPTR LVar12;
  DLword *__buf;
  DLword *pDVar13;
  uint uVar14;
  uint longwordcount;
  long lVar15;
  int iVar16;
  long lVar17;
  DLword *page;
  char tempname [4096];
  char local_1038 [4104];
  
  pLVar4 = FPtoVP;
  uVar1 = InterfacePage->nactivepages;
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 != 0) {
    return 0xe0006;
  }
  sprintf(local_1038,"%s-temp",sysout_file_name);
  alarm(TIMEOUT_TIME);
  piVar6 = __errno_location();
  do {
    *piVar6 = 0;
    iVar5 = open(sysout_file_name,1,0x1b6);
    if (iVar5 != -1) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      goto LAB_0013ac43;
    }
  } while (*piVar6 == 4);
  alarm(0);
  if (*piVar6 != 2) {
    return 0xe0003;
  }
  goto LAB_0013ac61;
  while (*piVar6 == 4) {
LAB_0013ac43:
    *piVar6 = 0;
    iVar16 = close(iVar5);
    if (iVar16 != -1) break;
  }
  alarm(0);
LAB_0013ac61:
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar6 = 0;
    iVar5 = open(local_1038,0x241,0x1b6);
    if (iVar5 != -1) break;
    if (*piVar6 != 4) {
      alarm(0);
      err_mess("open",*piVar6);
      return 0xe0003;
    }
  }
  alarm(0);
  pIVar7 = InterfacePage;
  InterfacePage->machinetype = 3;
  DVar10 = (DLword)*STORAGEFULLSTATE_word;
  if (DVar10 == 1) {
    *STORAGEFULLSTATE_word = 0;
    DVar10 = 0;
    pIVar7 = InterfacePage;
  }
  pIVar7->storagefullstate = DVar10;
  if (0 < (int)uVar1) {
    iVar16 = 0;
    do {
      lVar17 = (long)iVar16;
      uVar14 = pLVar4[lVar17 + 1];
      if (uVar14 < 0xffff0000) {
        alarm(TIMEOUT_TIME);
        while( true ) {
          *piVar6 = 0;
          _Var8 = lseek(iVar5,(long)(iVar16 << 9),0);
          if (_Var8 != -1) break;
          if (*piVar6 != 4) goto LAB_0013afc4;
        }
        alarm(0);
        if ((pLVar4[lVar17 + 1] == uVar14) && (iVar16 < (int)uVar1)) {
          iVar11 = 0;
          lVar2 = lVar17;
          do {
            uVar14 = uVar14 + 1;
            lVar15 = lVar2 + 1;
            iVar11 = iVar11 + -1;
            if (uVar14 != pLVar4[lVar2 + 2]) break;
            lVar2 = lVar15;
          } while (lVar15 < (long)(ulong)uVar1);
          iVar16 = iVar16 - iVar11;
          uVar14 = -iVar11;
        }
        else {
          uVar14 = 0;
        }
        page = Lisp_world + (pLVar4[lVar17 + 1] << 8);
        iVar16 = iVar16 + -1;
        longwordcount = uVar14 << 7;
        word_swap_page(page,longwordcount);
        uVar3 = TIMEOUT_TIME;
        __buf = page;
        if (maxpages < uVar14) {
          do {
            alarm(TIMEOUT_TIME);
            while( true ) {
              *piVar6 = 0;
              sVar9 = write(iVar5,__buf,(ulong)maxpages << 9);
              if (sVar9 != -1) break;
              if (*piVar6 != 4) {
                alarm(0);
                goto LAB_0013b049;
              }
            }
            alarm(0);
            __buf = __buf + (maxpages << 8);
            uVar14 = uVar14 - maxpages;
          } while (maxpages < uVar14);
          if (uVar14 == 0) {
            word_swap_page(page,longwordcount);
            goto LAB_0013af55;
          }
          pDVar13 = __buf;
          alarm(TIMEOUT_TIME);
          do {
            *piVar6 = 0;
            lVar17 = write(iVar5,__buf,(ulong)(uVar14 * 0x200));
            LVar12 = (LispPTR)pDVar13;
            if (lVar17 != -1) break;
          } while (*piVar6 == 4);
          alarm(0);
          if (sVar9 == -1) {
            return LVar12;
          }
        }
        else {
          TIMEOUT_TIME = (uVar14 >> 3) + TIMEOUT_TIME;
          alarm(TIMEOUT_TIME);
          do {
            *piVar6 = 0;
            lVar17 = write(iVar5,page,(ulong)(uVar14 << 9));
            if (lVar17 != -1) break;
          } while (*piVar6 == 4);
          alarm(0);
          TIMEOUT_TIME = uVar3;
        }
        word_swap_page(page,longwordcount);
        if (lVar17 == -1) goto LAB_0013b049;
      }
LAB_0013af55:
      iVar16 = iVar16 + 1;
    } while (iVar16 < (int)uVar1);
  }
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar6 = 0;
    _Var8 = lseek(iVar5,0x200,0);
    if (_Var8 != -1) break;
    if (*piVar6 != 4) {
LAB_0013afc4:
      alarm(0);
      err_mess("lseek",*piVar6);
      return 0xe0004;
    }
  }
  alarm(0);
  word_swap_page(InterfacePage,0x80);
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar6 = 0;
    sVar9 = write(iVar5,InterfacePage,0x200);
    if (sVar9 != -1) break;
    if (*piVar6 != 4) {
      alarm(0);
      word_swap_page(InterfacePage,0x80);
LAB_0013b049:
      err_mess("write",*piVar6);
      if (*piVar6 == 0x1c) {
        return 0xe0002;
      }
      return (uint)(*piVar6 != 0x7a) * 3 + 0xe0002;
    }
  }
  alarm(0);
  word_swap_page(InterfacePage,0x80);
  alarm(TIMEOUT_TIME);
  while( true ) {
    *piVar6 = 0;
    iVar16 = close(iVar5);
    if (iVar16 != -1) break;
    if (*piVar6 != 4) {
      alarm(0);
      return 0xe0005;
    }
  }
  alarm(0);
  alarm(TIMEOUT_TIME);
  do {
    *piVar6 = 0;
    iVar5 = unlink(sysout_file_name);
    if (iVar5 != -1) {
      alarm(0);
      goto LAB_0013b10d;
    }
  } while (*piVar6 == 4);
  alarm(0);
  if (*piVar6 != 2) {
    return 0xe0003;
  }
LAB_0013b10d:
  alarm(TIMEOUT_TIME);
  do {
    *piVar6 = 0;
    iVar5 = rename(local_1038,sysout_file_name);
    if (iVar5 != -1) {
      alarm(0);
      return 0;
    }
  } while (*piVar6 == 4);
  vmem_save_cold_1();
  return 0xe0005;
}

Assistant:

LispPTR vmem_save(char *sysout_file_name)
{
  int sysout; /* SysoutFile descriptor */
#ifdef BIGVM
  unsigned int *fptovp;
#else
  DLword *fptovp; /* FPTOVP */
#endif          /* BIGVM */
  int vmemsize; /* VMEMSIZE */
  int i;
  char tempname[MAXPATHLEN];
  ssize_t rsize;
  off_t roff;
  int rval;
#ifndef DOS
  extern int ScreenLocked;
  extern DLword *EmCursorX68K;
  extern DLword *EmCursorY68K;
  extern DLword NullCursor[];
  extern DLword *EmCursorBitMap68K;
#endif /* DOS */

/* remove cursor image from screen */

#ifdef   DOS
  /*  For DOS, must also take the mouse cursor away (it's  */
  /*  written into the display-region bitmap).	     */
  currentdsp->device.locked++;
  (currentdsp->mouse_invisible)(currentdsp, IOPage);
#endif /* SUNDISPLAY || DOS */

  /* set FPTOVP */
  fptovp = FPtoVP + 1;

  /* set VMEMSIZE */
  vmemsize = InterfacePage->nactivepages;

  /*	[HH:6-Jan-89]
          Sequence of save image
          (1) Sysout image is saved to a temporary file, tempname.
          (2) if a specified file, sysout_file_name, is exist, the file is removed.
          (3) the temporary file is renamed to the specified file.
  */

  SETJMP(FILETIMEOUT);
#ifdef DOS
  /* Bloddy 8 char filenames in dos ... /jarl */
  make_old_version(tempname, sysout_file_name);
#else  /* DOS */
  sprintf(tempname, "%s-temp", sysout_file_name);
#endif /* DOS */

  /* Confirm protection of specified file by open/close */

  TIMEOUT(sysout = open(sysout_file_name, O_WRONLY, 0666));
  if (sysout == -1) {
    /* No file error skip return. */
    if (errno != ENOENT) return (FILECANNOTOPEN); /* No such file error.*/
  } else
    TIMEOUT(rval = close(sysout));

  /* open temp file */
  TIMEOUT(sysout = open(tempname, O_WRONLY | O_CREAT | O_TRUNC, 0666));
  if (sysout == -1) {
    err_mess("open", errno);
    return (FILECANNOTOPEN);
  }

  InterfacePage->machinetype = MACHINETYPE_MAIKO;

  /* Restore storagefull state */
  if (((*STORAGEFULLSTATE_word) & 0xffff) == SFS_NOTSWITCHABLE) {
    /* This sysout uses only 8 Mbyte lisp space.
       It may be able to use this SYSOUT which has more than
       8 Mbyte lisp space.
       To enable to expand lisp space, \\STORAGEFULLSTATE
       should be NIL.
    */
    *STORAGEFULLSTATE_word = NIL;
    InterfacePage->storagefullstate = NIL;
  } else {
    /*  Otherwise, just restore storagefullstate in IFPAGE */
    InterfacePage->storagefullstate = (*STORAGEFULLSTATE_word) & 0xffff;
  }

/* First, sort fptovp table, trying to get pages contiguous */
#ifndef BIGVM
#ifndef BYTESWAP
  /* Byte-swapped machines don't sort the table right. */
  sort_fptovp(fptovp, vmemsize);
#endif
#endif

  /* store vmem to sysoutfile */

  for (i = 0; i < vmemsize; i++) {
    if (GETPAGEOK(fptovp, i) != 0177777) {
      unsigned int oldfptovp = GETFPTOVP(fptovp, i);
      unsigned int saveoldfptovp = oldfptovp;
      unsigned int contig_pages = 0;
      DLword *base_addr;

      TIMEOUT(roff = lseek(sysout, i * BYTESPER_PAGE, SEEK_SET));
      if (roff == -1) {
        err_mess("lseek", errno);
        return (FILECANNOTSEEK);
      }
      base_addr = Lisp_world + (GETFPTOVP(fptovp, i) * DLWORDSPER_PAGE);

      /* Now, let's see how many pages we can dump */
      while (GETFPTOVP(fptovp, i) == oldfptovp && i < vmemsize) {
        contig_pages++; oldfptovp++; i++;
      }
      i--; /* Previous loop always overbumps i */
      DBPRINT(("%4d: writing %d pages from %tx (%d)\n", i, contig_pages, (char *)base_addr - (char *)Lisp_world, saveoldfptovp));

#ifdef BYTESWAP
      word_swap_page(base_addr, contig_pages * CELLSPER_PAGE);
#endif /* BYTESWAP */

      if (contig_pages > maxpages) {
        DLword *ba = base_addr;
        unsigned int pc = contig_pages;
        while (pc > maxpages) {
          TIMEOUT(rsize = write(sysout, ba, (size_t)maxpages * BYTESPER_PAGE));
          if (rsize == -1) {
            err_mess("write", errno);
            return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
          }
          ba += maxpages * DLWORDSPER_PAGE;
          pc -= maxpages;
        }
        if (pc > 0) TIMEOUT(rsize = write(sysout, ba, pc * BYTESPER_PAGE));
      } else {
        unsigned int oldTT = TIMEOUT_TIME;
        /* As we can spend longer than TIMEOUT_TIME doing a big
           write, we adjust the timeout temporarily here */
        TIMEOUT_TIME += contig_pages >> 3;
        TIMEOUT(rsize = write(sysout, base_addr, contig_pages * BYTESPER_PAGE));
        TIMEOUT_TIME = oldTT;
      }
#ifdef BYTESWAP
      word_swap_page(base_addr, contig_pages * CELLSPER_PAGE);
#endif /* BYTESWAP */

      if (rsize == -1) {
        err_mess("write", errno);
	return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
      }
    }
  }

  /* seek to IFPAGE */
  TIMEOUT(roff = lseek(sysout, (long)FP_IFPAGE, SEEK_SET));
  if (roff == -1) {
    err_mess("lseek", errno);
    return (FILECANNOTSEEK);
  }
#ifdef BYTESWAP
  word_swap_page(InterfacePage, CELLSPER_PAGE);
#endif /* BYTESWAP */

  TIMEOUT(rsize = write(sysout, (char *)InterfacePage, BYTESPER_PAGE));
#ifdef BYTESWAP
  word_swap_page(InterfacePage, CELLSPER_PAGE);
#endif /* BYTESWAP */

  if (rsize == -1) {
    err_mess("write", errno);
	return ((errno == ENOSPC) || (errno == EDQUOT)) ? NOFILESPACE : FILECANNOTWRITE;
  }

#ifdef OS5
  /* Seems to write all pages at close, so timeout
     is WAY to short, no matter how big.  JDS 960925 */
  rval = close(sysout);
#else
  TIMEOUT(rval = close(sysout));
#endif /* OS5 */
  if (rval == -1) { return (FILECANNOTWRITE); }

  TIMEOUT(rval = unlink(sysout_file_name));
  if (rval == -1) {
    /* No file error skip return. */
    if (errno != ENOENT) /* No such file error.*/
      return (FILECANNOTOPEN);
  }

  TIMEOUT(rval = rename(tempname, sysout_file_name));
  if (rval == -1) {
    (void)fprintf(stderr, "sysout is saved to temp file, %s.", tempname);
    return (FILECANNOTWRITE);
  }

/* restore cursor image to screen */
#ifdef DOS
  /* Must also put the mouse back. */
  (currentdsp->mouse_visible)(IOPage->dlmousex, IOPage->dlmousey);
  currentdsp->device.locked--;

#endif /* SUNDISPLAY */

  /*printf("vmem is saved completely.\n");*/
  return (COMPLETESYSOUT);
}